

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void tlbiall_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  _Bool _Var1;
  CPUState *src_cpu;
  CPUState *cs;
  uint64_t value_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  src_cpu = env_cpu(env);
  _Var1 = tlb_force_broadcast(env);
  if (_Var1) {
    tlb_flush_all_cpus_synced_aarch64(src_cpu);
  }
  else {
    tlb_flush_aarch64(src_cpu);
  }
  return;
}

Assistant:

static void tlbiall_write(CPUARMState *env, const ARMCPRegInfo *ri,
                          uint64_t value)
{
    /* Invalidate all (TLBIALL) */
    CPUState *cs = env_cpu(env);

    if (tlb_force_broadcast(env)) {
        tlb_flush_all_cpus_synced(cs);
    } else {
        tlb_flush(cs);
    }
}